

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<short>::clear(PropertyT<short> *this)

{
  vector<short,_std::allocator<short>_> local_28;
  PropertyT<short> *local_10;
  PropertyT<short> *this_local;
  
  local_10 = this;
  std::vector<short,_std::allocator<short>_>::clear(&this->data_);
  memset(&local_28,0,0x18);
  std::vector<short,_std::allocator<short>_>::vector(&local_28);
  std::vector<short,_std::allocator<short>_>::swap(&local_28,&this->data_);
  std::vector<short,_std::allocator<short>_>::~vector(&local_28);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }